

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.h
# Opt level: O2

Builder * __thiscall
capnproto_test::capnp::test::TestGroups::Groups::Builder::initBar
          (Builder *__return_storage_ptr__,Builder *this)

{
  undefined4 *puVar1;
  SegmentBuilder *pSVar2;
  CapTableBuilder *pCVar3;
  WirePointer *pWVar4;
  StructPointerCount SVar5;
  undefined2 uVar6;
  PointerBuilder local_28;
  
  puVar1 = (undefined4 *)(this->_builder).data;
  *(undefined2 *)(puVar1 + 1) = 2;
  *puVar1 = 0;
  *(undefined8 *)(puVar1 + 2) = 0;
  local_28.pointer = (this->_builder).pointers;
  local_28.segment = (this->_builder).segment;
  local_28.capTable = (this->_builder).capTable;
  ::capnp::_::PointerBuilder::clear(&local_28);
  SVar5 = (this->_builder).pointerCount;
  uVar6 = *(undefined2 *)&(this->_builder).field_0x26;
  (__return_storage_ptr__->_builder).dataSize = (this->_builder).dataSize;
  (__return_storage_ptr__->_builder).pointerCount = SVar5;
  *(undefined2 *)&(__return_storage_ptr__->_builder).field_0x26 = uVar6;
  pSVar2 = (this->_builder).segment;
  pCVar3 = (this->_builder).capTable;
  pWVar4 = (this->_builder).pointers;
  (__return_storage_ptr__->_builder).data = (this->_builder).data;
  (__return_storage_ptr__->_builder).pointers = pWVar4;
  (__return_storage_ptr__->_builder).segment = pSVar2;
  (__return_storage_ptr__->_builder).capTable = pCVar3;
  return __return_storage_ptr__;
}

Assistant:

inline typename TestGroups::Groups::Bar::Builder TestGroups::Groups::Builder::initBar() {
  _builder.setDataField<TestGroups::Groups::Which>(
      ::capnp::bounded<2>() * ::capnp::ELEMENTS, TestGroups::Groups::BAR);
  _builder.setDataField< ::uint32_t>(::capnp::bounded<0>() * ::capnp::ELEMENTS, 0);
  _builder.setDataField< ::uint64_t>(::capnp::bounded<1>() * ::capnp::ELEMENTS, 0);
  _builder.getPointerField(::capnp::bounded<0>() * ::capnp::POINTERS).clear();
  return typename TestGroups::Groups::Bar::Builder(_builder);
}